

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

NamedTypeSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::NamedTypeSyntax,slang::syntax::NamedTypeSyntax_const&>
          (BumpAllocator *this,NamedTypeSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  NameSyntax *pNVar3;
  undefined4 uVar4;
  NamedTypeSyntax *pNVar5;
  
  pNVar5 = (NamedTypeSyntax *)allocate(this,0x20,8);
  uVar4 = *(undefined4 *)
           &(args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent;
  pSVar2 = (args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode;
  pNVar3 = (args->name).ptr;
  (pNVar5->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind =
       (args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind;
  *(undefined4 *)&(pNVar5->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4 =
       uVar4;
  (pNVar5->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = pSVar1;
  (pNVar5->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode = pSVar2;
  (pNVar5->name).ptr = pNVar3;
  return pNVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }